

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O3

void anon_unknown.dwarf_ae8::ndiBXHelper(ndicapi *api,char *command,char *commandReply)

{
  byte bVar1;
  int i;
  long lVar2;
  ulong uVar3;
  char cVar4;
  float *pfVar5;
  float *pfVar6;
  uint uVar7;
  ulong uVar8;
  char (*pacVar9) [3];
  int iVar10;
  float *pfVar11;
  char *pcVar12;
  float fVar13;
  
  uVar7 = 1;
  if (command[2] == ' ') {
    cVar4 = command[3];
  }
  else {
    if (command[2] != ':') goto LAB_001081ad;
    cVar4 = command[7];
  }
  if (cVar4 != '\r') {
    lVar2 = 0;
    uVar7 = 0;
    do {
      cVar4 = command[lVar2 + 3];
      iVar10 = -0x57;
      if (((5 < (byte)(cVar4 + 0x9fU)) && (iVar10 = -0x37, 5 < (byte)(cVar4 + 0xbfU))) &&
         (iVar10 = -0x30, 9 < (byte)(cVar4 - 0x30U))) break;
      uVar7 = uVar7 << 4 | iVar10 + cVar4;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
LAB_001081ad:
  if ((*commandReply == -0x3c) && (commandReply[1] == -0x5b)) {
    api->BxReplyLength = *(unsigned_short *)(commandReply + 2);
    bVar1 = commandReply[6];
    pfVar5 = (float *)(commandReply + 7);
    api->BxHandleCount = bVar1;
    if ((ulong)bVar1 != 0) {
      pacVar9 = api->Bx3DMarkerOutOfVolume;
      pcVar12 = api->BxToolMarkerInformation[0] + 1;
      pfVar11 = api->Bx3DMarkerPosition[0][0] + 2;
      uVar8 = 0;
      do {
        api->BxHandles[uVar8] = *(char *)pfVar5;
        cVar4 = *(char *)((long)pfVar5 + 1);
        api->BxHandlesStatus[uVar8] = cVar4;
        pfVar6 = (float *)((long)pfVar5 + 2);
        if (cVar4 != '\x04') {
          if ((uVar7 & 1) != 0) {
            if (cVar4 != '\x02') {
              api->BxTransforms[uVar8][0] = *(float *)((long)pfVar5 + 2);
              api->BxTransforms[uVar8][1] = *(float *)((long)pfVar5 + 6);
              api->BxTransforms[uVar8][2] = *(float *)((long)pfVar5 + 10);
              api->BxTransforms[uVar8][3] = *(float *)((long)pfVar5 + 0xe);
              api->BxTransforms[uVar8][4] = *(float *)((long)pfVar5 + 0x12);
              api->BxTransforms[uVar8][5] = *(float *)((long)pfVar5 + 0x16);
              api->BxTransforms[uVar8][6] = *(float *)((long)pfVar5 + 0x1a);
              api->BxTransforms[uVar8][7] = *(float *)((long)pfVar5 + 0x1e);
              pfVar6 = (float *)((long)pfVar5 + 0x22);
            }
            api->BxPortStatus[uVar8] =
                 (uint)*(byte *)((long)pfVar6 + 3) << 0x18 |
                 (int)*(char *)((long)pfVar6 + 2) << 0x10 |
                 (int)*(char *)((long)pfVar6 + 1) << 8 | (int)*(char *)pfVar6;
            api->BxFrameNumber[uVar8] = (uint)pfVar6[1];
            pfVar6 = pfVar6 + 2;
          }
          if ((uVar7 & 2) != 0) {
            api->BxToolMarkerInformation[uVar8][0] = *(char *)pfVar6;
            lVar2 = 0;
            do {
              pcVar12[lVar2] = *(char *)((long)pfVar6 + lVar2 + 1);
              lVar2 = lVar2 + 1;
            } while (lVar2 != 10);
            pfVar6 = (float *)((long)pfVar6 + 0xb);
          }
          if ((uVar7 & 4) != 0) {
            cVar4 = *(char *)pfVar6;
            api->BxActiveSingleStrayMarkerStatus[uVar8] = cVar4;
            if (cVar4 == '\0') {
              pfVar6 = (float *)((long)pfVar6 + 1);
            }
            else {
              api->BxActiveSingleStrayMarkerPosition[uVar8][0] = *(float *)((long)pfVar6 + 1);
              api->BxActiveSingleStrayMarkerPosition[uVar8][1] = *(float *)((long)pfVar6 + 5);
              api->BxActiveSingleStrayMarkerPosition[uVar8][2] = *(float *)((long)pfVar6 + 9);
              pfVar6 = (float *)((long)pfVar6 + 0xd);
            }
          }
          if ((uVar7 & 8) != 0) {
            cVar4 = *(char *)pfVar6;
            api->Bx3DMarkerCount[uVar8] = cVar4;
            fVar13 = ceilf((float)(int)cVar4 * 0.125);
            pfVar6 = (float *)((long)pfVar6 + 1);
            if (0 < (int)fVar13) {
              uVar3 = 0;
              do {
                (*pacVar9)[uVar3] = *(char *)((long)pfVar6 + uVar3);
                uVar3 = uVar3 + 1;
              } while ((uint)(int)fVar13 != uVar3);
              cVar4 = api->Bx3DMarkerCount[uVar8];
              pfVar6 = (float *)((long)pfVar6 + uVar3);
            }
            if ('\0' < cVar4) {
              lVar2 = 0;
              pfVar5 = pfVar11;
              do {
                (*(float (*) [3])(pfVar5 + -2))[0] = *pfVar6;
                pfVar5[-1] = pfVar6[1];
                *pfVar5 = pfVar6[2];
                pfVar6 = pfVar6 + 3;
                lVar2 = lVar2 + 1;
                pfVar5 = pfVar5 + 3;
              } while (lVar2 < api->Bx3DMarkerCount[uVar8]);
            }
          }
        }
        pfVar5 = pfVar6;
        uVar8 = uVar8 + 1;
        pcVar12 = pcVar12 + 0xb;
        pacVar9 = pacVar9 + 1;
        pfVar11 = pfVar11 + 0x3c;
      } while (uVar8 != bVar1);
    }
    if ((uVar7 >> 0xc & 1) != 0) {
      cVar4 = *(char *)pfVar5;
      uVar7 = (uint)cVar4;
      api->BxPassiveStrayCount = uVar7;
      fVar13 = ceilf((float)(int)uVar7 * 0.125);
      pfVar5 = (float *)((long)pfVar5 + 1);
      if (0 < (int)fVar13) {
        uVar8 = 0;
        do {
          api->BxPassiveStrayOutOfVolume[uVar8] = *(char *)((long)pfVar5 + uVar8);
          uVar8 = uVar8 + 1;
        } while ((uint)(int)fVar13 != uVar8);
        pfVar5 = (float *)((long)pfVar5 + uVar8);
      }
      if ('\0' < cVar4) {
        lVar2 = 0;
        do {
          *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + lVar2) =
               *(undefined4 *)((long)pfVar5 + lVar2);
          *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + lVar2 + 4) =
               *(undefined4 *)((long)pfVar5 + lVar2 + 4);
          *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + lVar2 + 8) =
               *(undefined4 *)((long)pfVar5 + lVar2 + 8);
          lVar2 = lVar2 + 0xc;
        } while ((ulong)uVar7 * 0xc != lVar2);
        pfVar5 = (float *)((long)pfVar5 + lVar2);
      }
    }
    api->BxSystemStatus = (int)*(char *)pfVar5 | (int)*(char *)((long)pfVar5 + 1) << 8;
  }
  return;
}

Assistant:

void ndiBXHelper(ndicapi* api, const char* command, const char* commandReply)
  {
    // Reply options
    // NDI_XFORMS_AND_STATUS  0x0001  /* transforms and status */
    // NDI_ADDITIONAL_INFO    0x0002  /* additional tool transform info */
    // NDI_SINGLE_STRAY       0x0004  /* stray active marker reporting */
    // NDI_FRAME_NUMBER       0x0008  /* frame number for each tool */
    // NDI_PASSIVE            0x8000  /* report passive tool information */
    // NDI_PASSIVE_EXTRA      0x2000  /* add 6 extra passive tools */
    // NDI_PASSIVE_STRAY      0x1000  /* stray passive marker reporting */
    unsigned long mode = NDI_XFORMS_AND_STATUS;
    const char* replyIndex;
    unsigned short headerCRC;

    // if the BX command had a reply option, read it
    if ((command[2] == ':' && command[7] != '\r') || (command[2] == ' ' && command[3] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[3], 4);
    }

    replyIndex = &commandReply[0];

    // Confirm start sequence
    if (replyIndex[0] != (char)0xc4 || replyIndex[1] != (char)0xa5)  // little endian
    {
      // Something isn't right, abort
      return;
    }
    replyIndex += 2;

    // Get the reply length
    api->BxReplyLength = (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[0];
    replyIndex += 2;

    // Get the CRC
    headerCRC = (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[0];
    replyIndex += 2;

    // Get the number of handles
    api->BxHandleCount = (unsigned char)replyIndex[0];
    replyIndex += 1;

    // Go through the information for each handle
    for (unsigned short i = 0; i < api->BxHandleCount; i++)
    {
      // get the handle itself
      api->BxHandles[i] = (char)replyIndex[0];
      replyIndex++;

      api->BxHandlesStatus[i] = (char)replyIndex[0];
      replyIndex++;

      // Disabled handles have no reply data
      if (api->BxHandlesStatus[i] == NDI_HANDLE_DISABLED)
      {
        continue;
      }

      if (mode & NDI_XFORMS_AND_STATUS)
      {
        if (api->BxHandlesStatus[i] != NDI_HANDLE_MISSING)
        {
          // 4 float, Q0, Qx, Qy, Qz
          api->BxTransforms[i][0] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][1] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][2] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][3] = *(float*)replyIndex;
          replyIndex += 4;

          // 3 float, Tx, Ty, Tz
          api->BxTransforms[i][4] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][5] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][6] = *(float*)replyIndex;
          replyIndex += 4;

          // 1 float, RMS error
          api->BxTransforms[i][7] = *(float*)replyIndex;
          replyIndex += 4;
        }
        // 4 bytes port status
        api->BxPortStatus[i] = (int)replyIndex[0] | (int)replyIndex[1] << 8 | (int)replyIndex[2] << 16 | (int)replyIndex[3] << 24;
        replyIndex += 4;
        // 4 bytes frame number
        api->BxFrameNumber[i] = (unsigned char)replyIndex[0] | (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[2] << 16 | (unsigned char)replyIndex[3] << 24;
        replyIndex += 4;
      }

      // grab additional information
      if (mode & NDI_ADDITIONAL_INFO)
      {
        api->BxToolMarkerInformation[i][0] = (char)replyIndex[0];
        replyIndex++;
        for (int j = 0; j < 10; j++)
        {
          api->BxToolMarkerInformation[i][j + 1] = (char)replyIndex[0];
          replyIndex++;
        }
      }

      // grab the single marker info
      if (mode & NDI_SINGLE_STRAY)
      {
        char activeStatus = (char)replyIndex[0];
        replyIndex++;
        api->BxActiveSingleStrayMarkerStatus[i] = activeStatus;

        if (activeStatus != 0x00 || (mode & NDI_NOT_NORMALLY_REPORTED && activeStatus & NDI_ACTIVE_STRAY_OUT_OF_VOLUME))
        {
          // Marker is not missing, or it is out-of-volume and not-normally-requested is requested
          // Either means we have data...
          // 3 float, Tx, Ty, Tz
          api->BxActiveSingleStrayMarkerPosition[i][0] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxActiveSingleStrayMarkerPosition[i][1] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxActiveSingleStrayMarkerPosition[i][2] = *(float*)replyIndex;
          replyIndex += 4;
        }
      }

      if (mode & NDI_3D_MARKER_POSITIONS)
      {
        // Save marker count
        api->Bx3DMarkerCount[i] = (char)replyIndex[0];
        replyIndex++;

        // Save off out of volume status
        int numBytes = static_cast<int>(ceilf(api->Bx3DMarkerCount[i] / 8.f));
        for (int j = 0; j < numBytes; ++j)
        {
          api->Bx3DMarkerOutOfVolume[i][j] = (char)replyIndex[0];
          ++replyIndex;
        }

        for (int j = 0; j < api->Bx3DMarkerCount[i]; ++j)
        {
          // 3 float, Tx, Ty, Tz
          api->Bx3DMarkerPosition[i][j][0] = *(float*)replyIndex;
          replyIndex += 4;
          api->Bx3DMarkerPosition[i][j][1] = *(float*)replyIndex;
          replyIndex += 4;
          api->Bx3DMarkerPosition[i][j][2] = *(float*)replyIndex;
          replyIndex += 4;
        }
      }
    }

    if (mode & NDI_PASSIVE_STRAY)
    {
      // Save marker count
      api->BxPassiveStrayCount = (char)replyIndex[0];
      replyIndex++;

      if (api->BxPassiveStrayCount > 240)
      {
        // This implementation cannot report on more than 240 stray passive markers
        api->BxPassiveStrayCount = 240;
      }

      // Save off out of volume status
      int numBytes = static_cast<int>(ceilf(api->BxPassiveStrayCount / 8.f));
      for (int j = 0; j < numBytes; ++j)
      {
        api->BxPassiveStrayOutOfVolume[j] = (char)replyIndex[0];
        ++replyIndex;
      }

      for (int j = 0; j < api->BxPassiveStrayCount; ++j)
      {
        // 3 float, Tx, Ty, Tz
        api->BxPassiveStrayPosition[j][0] = *(float*)replyIndex;
        replyIndex += 4;
        api->BxPassiveStrayPosition[j][1] = *(float*)replyIndex;
        replyIndex += 4;
        api->BxPassiveStrayPosition[j][2] = *(float*)replyIndex;
        replyIndex += 4;
      }
    }

    // Get the system status
    api->BxSystemStatus = (char)replyIndex[1] << 8 | (char)replyIndex[0];
    replyIndex += 2;
  }